

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_boundary_z2_operators<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
               (vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                *matrix)

{
  ulong *puVar1;
  uint uVar2;
  pointer pVVar3;
  pointer ppEVar4;
  __buckets_ptr pp_Var5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  _Hash_node_base _Var8;
  bool bVar9;
  _Hash_node_base *p_Var10;
  __hash_code __code;
  ulong uVar11;
  pointer ppEVar12;
  uint uVar13;
  __node_base _Var14;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __first1_00;
  _Bit_const_iterator __first1_01;
  _Bit_const_iterator __first1_02;
  _Bit_const_iterator __first1_03;
  _Bit_const_iterator __first1_04;
  _Bit_const_iterator __last1;
  _Bit_const_iterator __last1_00;
  _Bit_const_iterator __last1_01;
  _Bit_const_iterator __last1_02;
  _Bit_const_iterator __last1_03;
  _Bit_const_iterator __last1_04;
  _Bit_const_iterator __first2;
  _Bit_const_iterator __first2_00;
  _Bit_const_iterator __first2_01;
  _Bit_const_iterator __first2_02;
  _Bit_const_iterator __first2_03;
  _Bit_const_iterator __first2_04;
  Column_settings settings;
  vector<bool,_std::allocator<bool>_> container_5;
  vector<bool,_std::allocator<bool>_> veccont;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  local_4f8;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  *local_4f0;
  char *pcStack_4e8;
  shared_count sStack_4e0;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  *local_4d8;
  undefined4 *local_4d0;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  local_4c8;
  char *local_4c0;
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  col2;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  local_440;
  char *local_438;
  shared_count sStack_430;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  *local_428;
  char *local_420;
  shared_count sStack_418;
  char *local_410;
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  col4;
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  col3;
  long local_310;
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  col1;
  undefined4 local_28c;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  col0;
  
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  col2.super_Row_access_option.columnIndex_ = 0;
  col2.super_Row_access_option._4_4_ = 1;
  col2.super_Row_access_option.rows_ = (Row_container *)0x500000002;
  col2.super_Column_dimension_option.dim_ = 6;
  __l._M_len = 5;
  __l._M_array = (iterator)&col2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col1,__l,
             (allocator_type *)&col3);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::Vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)&col0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col1,&settings);
  if (col1.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col1.super_Row_access_option._0_8_,
                    col1._16_8_ - col1.super_Row_access_option._0_8_);
  }
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  _add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)(matrix->
                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,&col0);
  col1.super_Row_access_option._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,&col1);
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x3bf);
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
           (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
           veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar13 < 0) {
    ppEVar12 = *(pointer *)
                ((long)&(pVVar3->column_).
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar12 !=
        (pVVar3->column_).
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = ppEVar12[-1]->rowIndex_ + 1;
      goto LAB_0017cfe7;
    }
    col1.super_Column_dimension_option.dim_ = 0;
    col1._20_4_ = 0;
    col1.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    col1.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    col1.super_Row_access_option.columnIndex_ = 0;
    col1.super_Row_access_option._4_4_ = 0;
    col1.super_Row_access_option.rows_ = (Row_container *)0x0;
    col1.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
LAB_0017cfe7:
    col2.super_Row_access_option._0_8_ = col2.super_Row_access_option._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col1,(long)(int)uVar13,(bool *)&col2,
               (allocator_type *)&col4);
    ppEVar12 = (pVVar3->column_).
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppEVar4 = *(pointer *)
               ((long)&(pVVar3->column_).
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar12 != ppEVar4) {
      pp_Var5 = (pVVar3->erasedValues_)._M_h._M_buckets;
      do {
        uVar2 = (*ppEVar12)->rowIndex_;
        if (uVar13 <= uVar2) break;
        uVar6 = (pVVar3->erasedValues_)._M_h._M_bucket_count;
        uVar11 = (ulong)uVar2 % uVar6;
        p_Var7 = pp_Var5[uVar11];
        p_Var10 = (_Hash_node_base *)0x0;
        if ((p_Var7 != (__node_base_ptr)0x0) &&
           (p_Var10 = p_Var7, _Var14._M_nxt = p_Var7->_M_nxt,
           uVar2 != *(uint *)&p_Var7->_M_nxt[1]._M_nxt)) {
          while (_Var8._M_nxt = (_Var14._M_nxt)->_M_nxt, _Var8._M_nxt != (_Hash_node_base *)0x0) {
            p_Var10 = (_Hash_node_base *)0x0;
            if (((ulong)*(uint *)&_Var8._M_nxt[1]._M_nxt % uVar6 != uVar11) ||
               (p_Var10 = _Var14._M_nxt, _Var14._M_nxt = _Var8._M_nxt,
               uVar2 == *(uint *)&_Var8._M_nxt[1]._M_nxt)) goto LAB_0017d08b;
          }
          p_Var10 = (_Hash_node_base *)0x0;
        }
LAB_0017d08b:
        if ((p_Var10 == (_Hash_node_base *)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0)) {
          puVar1 = (ulong *)(col1.super_Row_access_option._0_8_ + (ulong)(uVar2 >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
        }
        ppEVar12 = ppEVar12 + 1;
      } while (ppEVar12 != ppEVar4);
    }
  }
  __last1.super__Bit_iterator_base._M_offset =
       (uint)col1.column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  __last1.super__Bit_iterator_base._M_p = (_Bit_type *)col1._16_8_;
  if ((ulong)(uint)col1.column_.
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start +
      (col1._16_8_ - col1.super_Row_access_option._0_8_) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first1.super__Bit_iterator_base._8_8_ = 0;
    __first1.super__Bit_iterator_base._M_p = (_Bit_type *)col1.super_Row_access_option._0_8_;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    bVar9 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1,__last1,__first2);
  }
  else {
    bVar9 = false;
  }
  col3.super_Row_access_option.columnIndex_._0_1_ = bVar9;
  col3.super_Row_access_option.rows_ = (Row_container *)0x0;
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 0;
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&col4;
  col4.super_Row_access_option._0_8_ = anon_var_dwarf_c6a11;
  col4.super_Row_access_option.rows_ = (Row_container *)0x1f296b;
  col2.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col2.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022f388;
  col2.super_Column_dimension_option.dim_ = 0x237120;
  col2._20_4_ = 0;
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d0 = "";
  boost::test_tools::tt_detail::report_assertion(&col3,&col2,&local_d8,0x3bf,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col3.super_Column_dimension_option);
  if (col1.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col1.super_Row_access_option._0_8_,
                    (long)col1.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    col1.super_Row_access_option._0_8_);
    col1.super_Row_access_option.columnIndex_ = 0;
    col1.super_Row_access_option._4_4_ = 0;
    col1.super_Row_access_option.rows_ =
         (Row_container *)((ulong)col1.super_Row_access_option.rows_ & 0xffffffff00000000);
    col1.super_Column_dimension_option.dim_ = 0;
    col1._20_4_ = 0;
    col1.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    col1.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x3c1);
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022f440;
  col3.super_Column_dimension_option.dim_ = 0x237120;
  col3._20_4_ = 0;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x1ec196;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_440 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )(((long)*(pointer *)
                         ((long)&(pVVar3->column_).
                                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                                 ._M_impl + 8) -
                  *(long *)&(pVVar3->column_).
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data >> 3) -
                (pVVar3->erasedValues_)._M_h._M_element_count);
  local_4f0 = &local_440;
  local_428 = &local_4c8;
  col4.super_Row_access_option.columnIndex_._0_1_ =
       local_440 ==
       (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
        )0x3;
  local_4c8.super_Entry_column_index_option.columnIndex_ = 3;
  col4.super_Row_access_option.rows_ = (Row_container *)0x0;
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)anon_var_dwarf_b022f;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
       + 0x73;
  col1.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_4f0;
  col1.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col1.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col1.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022f400;
  col1._16_8_ = &boost::unit_test::lazy_ostream::inst;
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_428;
  col2.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col2.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022f6c0;
  col2.super_Column_dimension_option.dim_ = 0x237120;
  col2._20_4_ = 0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&col4.super_Column_dimension_option);
  col3.super_Row_access_option.columnIndex_ = 0;
  col3.super_Row_access_option._4_4_ = 1;
  col3.super_Row_access_option.rows_ = (Row_container *)0x500000002;
  col3.super_Column_dimension_option.dim_ = 6;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&col3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col2,__l_00,
             (allocator_type *)&col4);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::Vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)&col1,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col2,&settings);
  if (col2.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col2.super_Row_access_option._0_8_,
                    CONCAT44(col2._20_4_,col2.super_Column_dimension_option.dim_) -
                    col2.super_Row_access_option._0_8_);
  }
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  _add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1),&col1);
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,0,0);
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0x3c8);
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
           (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
           veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar13 < 0) {
    ppEVar12 = *(pointer *)
                ((long)&pVVar3[1].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar12 !=
        pVVar3[1].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = ppEVar12[-1]->rowIndex_ + 1;
      goto LAB_0017d462;
    }
    col2.super_Column_dimension_option.dim_ = 0;
    col2._20_4_ = 0;
    col2.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    col2.super_Row_access_option.columnIndex_ = 0;
    col2.super_Row_access_option._4_4_ = 0;
    col2.super_Row_access_option.rows_ = (Row_container *)0x0;
    col2.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
LAB_0017d462:
    col3.super_Row_access_option._0_8_ = col3.super_Row_access_option._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col2,(long)(int)uVar13,(bool *)&col3,
               (allocator_type *)&container_5);
    ppEVar12 = pVVar3[1].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppEVar4 = *(pointer *)
               ((long)&pVVar3[1].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar12 != ppEVar4) {
      pp_Var5 = pVVar3[1].erasedValues_._M_h._M_buckets;
      do {
        uVar2 = (*ppEVar12)->rowIndex_;
        if (uVar13 <= uVar2) break;
        uVar6 = pVVar3[1].erasedValues_._M_h._M_bucket_count;
        uVar11 = (ulong)uVar2 % uVar6;
        p_Var7 = pp_Var5[uVar11];
        p_Var10 = (_Hash_node_base *)0x0;
        if ((p_Var7 != (__node_base_ptr)0x0) &&
           (p_Var10 = p_Var7, _Var14._M_nxt = p_Var7->_M_nxt,
           uVar2 != *(uint *)&p_Var7->_M_nxt[1]._M_nxt)) {
          while (_Var8._M_nxt = (_Var14._M_nxt)->_M_nxt, _Var8._M_nxt != (_Hash_node_base *)0x0) {
            p_Var10 = (_Hash_node_base *)0x0;
            if (((ulong)*(uint *)&_Var8._M_nxt[1]._M_nxt % uVar6 != uVar11) ||
               (p_Var10 = _Var14._M_nxt, _Var14._M_nxt = _Var8._M_nxt,
               uVar2 == *(uint *)&_Var8._M_nxt[1]._M_nxt)) goto LAB_0017d513;
          }
          p_Var10 = (_Hash_node_base *)0x0;
        }
LAB_0017d513:
        if ((p_Var10 == (_Hash_node_base *)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0)) {
          puVar1 = (ulong *)(col2.super_Row_access_option._0_8_ + (ulong)(uVar2 >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
        }
        ppEVar12 = ppEVar12 + 1;
      } while (ppEVar12 != ppEVar4);
    }
  }
  __last1_00.super__Bit_iterator_base._M_p._4_4_ = col2._20_4_;
  __last1_00.super__Bit_iterator_base._M_p._0_4_ = col2.super_Column_dimension_option.dim_;
  __last1_00.super__Bit_iterator_base._M_offset =
       col2.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  if (((ulong)col2.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start & 0xffffffff) +
      (CONCAT44(col2._20_4_,col2.super_Column_dimension_option.dim_) -
      col2.super_Row_access_option._0_8_) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first1_00.super__Bit_iterator_base._8_8_ = 0;
    __first1_00.super__Bit_iterator_base._M_p = (_Bit_type *)col2.super_Row_access_option._0_8_;
    __last1_00.super__Bit_iterator_base._12_4_ = 0;
    __first2_00.super__Bit_iterator_base._8_8_ = 0;
    __first2_00.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    bVar9 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_00,__last1_00,__first2_00);
  }
  else {
    bVar9 = false;
  }
  col4.super_Row_access_option.columnIndex_._0_1_ = bVar9;
  col4.super_Row_access_option.rows_ = (Row_container *)0x0;
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)anon_var_dwarf_c6a46;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = (long)"matrix[1].get_content(veccont.size()) == veccont" + 0x30;
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022f388;
  col3.super_Column_dimension_option.dim_ = 0x237120;
  col3._20_4_ = 0;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&container_5;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_120 = "";
  boost::test_tools::tt_detail::report_assertion(&col4,&col3,&local_128,0x3c8,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.super_Column_dimension_option);
  if (col2.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col2.super_Row_access_option._0_8_,
                    (long)col2.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    col2.super_Row_access_option._0_8_);
    col2.super_Row_access_option.columnIndex_ = 0;
    col2.super_Row_access_option._4_4_ = 0;
    col2.super_Row_access_option.rows_ =
         (Row_container *)((ulong)col2.super_Row_access_option.rows_ & 0xffffffff00000000);
    col2.super_Column_dimension_option.dim_ = 0;
    col2._20_4_ = 0;
    col2.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)col2.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    col2.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0x3ca);
  col4.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col4.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022f440;
  col4._16_8_ = &boost::unit_test::lazy_ostream::inst;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x1ec196;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_4c8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )(((long)*(pointer *)
                         ((long)&pVVar3[1].column_.
                                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                                 ._M_impl + 8) -
                  *(long *)&pVVar3[1].column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data >> 3) -
                pVVar3[1].erasedValues_._M_h._M_element_count);
  local_440 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )&local_4f8;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT71(container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,
                local_4c8 ==
                (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                 )0x0);
  local_4f8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )((ulong)local_4f8.rowIndex_ << 0x20);
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._12_4_ = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  col2.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col2.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  local_4f0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x1ecc81;
  pcStack_4e8 = "";
  local_428 = &local_4c8;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022f400;
  col2.super_Column_dimension_option.dim_ = 0x237120;
  col2._20_4_ = 0;
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_428;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022f6c0;
  col3.super_Column_dimension_option.dim_ = 0x237120;
  col3._20_4_ = 0;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_440;
  boost::test_tools::tt_detail::report_assertion
            (&container_5,&col4,&local_4f0,0x3ca,1,2,2,"matrix[1].size()",&col2,"0",&col3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish);
  col2.super_Row_access_option.columnIndex_._0_1_ = 1;
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  multiply_target_and_add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 4),(Field_element *)&col2,&col1);
  col2.super_Row_access_option._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,&col2);
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0x3d0);
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
           (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
           veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar13 < 0) {
    ppEVar12 = *(pointer *)
                ((long)&pVVar3[4].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar12 !=
        pVVar3[4].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = ppEVar12[-1]->rowIndex_ + 1;
      goto LAB_0017d8c7;
    }
    col2.super_Column_dimension_option.dim_ = 0;
    col2._20_4_ = 0;
    col2.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    col2.super_Row_access_option.columnIndex_ = 0;
    col2.super_Row_access_option._4_4_ = 0;
    col2.super_Row_access_option.rows_ = (Row_container *)0x0;
    col2.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
LAB_0017d8c7:
    col3.super_Row_access_option._0_8_ = col3.super_Row_access_option._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col2,(long)(int)uVar13,(bool *)&col3,
               (allocator_type *)&container_5);
    ppEVar12 = pVVar3[4].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppEVar4 = *(pointer *)
               ((long)&pVVar3[4].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar12 != ppEVar4) {
      pp_Var5 = pVVar3[4].erasedValues_._M_h._M_buckets;
      do {
        uVar2 = (*ppEVar12)->rowIndex_;
        if (uVar13 <= uVar2) break;
        uVar6 = pVVar3[4].erasedValues_._M_h._M_bucket_count;
        uVar11 = (ulong)uVar2 % uVar6;
        p_Var7 = pp_Var5[uVar11];
        p_Var10 = (_Hash_node_base *)0x0;
        if ((p_Var7 != (__node_base_ptr)0x0) &&
           (p_Var10 = p_Var7, _Var14._M_nxt = p_Var7->_M_nxt,
           uVar2 != *(uint *)&p_Var7->_M_nxt[1]._M_nxt)) {
          while (_Var8._M_nxt = (_Var14._M_nxt)->_M_nxt, _Var8._M_nxt != (_Hash_node_base *)0x0) {
            p_Var10 = (_Hash_node_base *)0x0;
            if (((ulong)*(uint *)&_Var8._M_nxt[1]._M_nxt % uVar6 != uVar11) ||
               (p_Var10 = _Var14._M_nxt, _Var14._M_nxt = _Var8._M_nxt,
               uVar2 == *(uint *)&_Var8._M_nxt[1]._M_nxt)) goto LAB_0017d978;
          }
          p_Var10 = (_Hash_node_base *)0x0;
        }
LAB_0017d978:
        if ((p_Var10 == (_Hash_node_base *)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0)) {
          puVar1 = (ulong *)(col2.super_Row_access_option._0_8_ + (ulong)(uVar2 >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
        }
        ppEVar12 = ppEVar12 + 1;
      } while (ppEVar12 != ppEVar4);
    }
  }
  __last1_01.super__Bit_iterator_base._M_p._4_4_ = col2._20_4_;
  __last1_01.super__Bit_iterator_base._M_p._0_4_ = col2.super_Column_dimension_option.dim_;
  __last1_01.super__Bit_iterator_base._M_offset =
       col2.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  if (((ulong)col2.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start & 0xffffffff) +
      (CONCAT44(col2._20_4_,col2.super_Column_dimension_option.dim_) -
      col2.super_Row_access_option._0_8_) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first1_01.super__Bit_iterator_base._8_8_ = 0;
    __first1_01.super__Bit_iterator_base._M_p = (_Bit_type *)col2.super_Row_access_option._0_8_;
    __last1_01.super__Bit_iterator_base._12_4_ = 0;
    __first2_01.super__Bit_iterator_base._8_8_ = 0;
    __first2_01.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    bVar9 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_01,__last1_01,__first2_01);
  }
  else {
    bVar9 = false;
  }
  col4.super_Row_access_option.columnIndex_._0_1_ = bVar9;
  col4.super_Row_access_option.rows_ = (Row_container *)0x0;
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)anon_var_dwarf_c6a6d;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = (long)"matrix[4].get_content(veccont.size()) == veccont" + 0x30;
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022f388;
  col3.super_Column_dimension_option.dim_ = 0x237120;
  col3._20_4_ = 0;
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_170 = "";
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&container_5;
  boost::test_tools::tt_detail::report_assertion(&col4,&col3,&local_178,0x3d0,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.super_Column_dimension_option);
  if (col2.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col2.super_Row_access_option._0_8_,
                    (long)col2.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    col2.super_Row_access_option._0_8_);
    col2.super_Row_access_option.columnIndex_ = 0;
    col2.super_Row_access_option._4_4_ = 0;
    col2.super_Row_access_option.rows_ =
         (Row_container *)((ulong)col2.super_Row_access_option.rows_ & 0xffffffff00000000);
    col2.super_Column_dimension_option.dim_ = 0;
    col2._20_4_ = 0;
    col2.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)col2.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    col2.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_188,0x3d2);
  col4.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col4.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022f440;
  col4._16_8_ = &boost::unit_test::lazy_ostream::inst;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x1ec196;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_4c8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )(((long)*(pointer *)
                         ((long)&pVVar3[4].column_.
                                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                                 ._M_impl + 8) -
                  *(long *)&pVVar3[4].column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data >> 3) -
                pVVar3[4].erasedValues_._M_h._M_element_count);
  col2.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col2.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022f400;
  col2.super_Column_dimension_option.dim_ = 0x237120;
  col2._20_4_ = 0;
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_428;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT71(container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,
                local_4c8 ==
                (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                 )0x3);
  local_4f8.super_Entry_column_index_option.columnIndex_ = 3;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._12_4_ = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  local_4f0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x1ecc81;
  pcStack_4e8 = "";
  local_428 = &local_4c8;
  local_440 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )&local_4f8;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022f6c0;
  col3.super_Column_dimension_option.dim_ = 0x237120;
  col3._20_4_ = 0;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_440;
  boost::test_tools::tt_detail::report_assertion
            (&container_5,&col4,&local_4f0,0x3d2,1,2,2,"matrix[4].size()",&col2,"3",&col3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish);
  col3.super_Row_access_option.columnIndex_ = 0;
  col3.super_Row_access_option._4_4_ = 0;
  col3.super_Row_access_option.rows_ = (Row_container *)0x0;
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 0;
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::Vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)&col2,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col3,&settings);
  if (col3.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col3.super_Row_access_option._0_8_,
                    CONCAT44(col3._20_4_,col3.super_Column_dimension_option.dim_) -
                    col3.super_Row_access_option._0_8_);
  }
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  _add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 5),&col2);
  col3.super_Row_access_option._0_7_ = 0x1010000010101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,&col3);
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0x3d8);
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
           (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
           veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar13 < 0) {
    ppEVar12 = *(pointer *)
                ((long)&pVVar3[5].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar12 !=
        pVVar3[5].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = ppEVar12[-1]->rowIndex_ + 1;
      goto LAB_0017dd6a;
    }
    col3.super_Column_dimension_option.dim_ = 0;
    col3._20_4_ = 0;
    col3.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    col3.super_Row_access_option.columnIndex_ = 0;
    col3.super_Row_access_option._4_4_ = 0;
    col3.super_Row_access_option.rows_ = (Row_container *)0x0;
    col3.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
LAB_0017dd6a:
    col4.super_Row_access_option._0_8_ = col4.super_Row_access_option._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col3,(long)(int)uVar13,(bool *)&col4,
               (allocator_type *)&local_4f0);
    ppEVar12 = pVVar3[5].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppEVar4 = *(pointer *)
               ((long)&pVVar3[5].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar12 != ppEVar4) {
      pp_Var5 = pVVar3[5].erasedValues_._M_h._M_buckets;
      do {
        uVar2 = (*ppEVar12)->rowIndex_;
        if (uVar13 <= uVar2) break;
        uVar6 = pVVar3[5].erasedValues_._M_h._M_bucket_count;
        uVar11 = (ulong)uVar2 % uVar6;
        p_Var7 = pp_Var5[uVar11];
        p_Var10 = (_Hash_node_base *)0x0;
        if ((p_Var7 != (__node_base_ptr)0x0) &&
           (p_Var10 = p_Var7, _Var14._M_nxt = p_Var7->_M_nxt,
           uVar2 != *(uint *)&p_Var7->_M_nxt[1]._M_nxt)) {
          while (_Var8._M_nxt = (_Var14._M_nxt)->_M_nxt, _Var8._M_nxt != (_Hash_node_base *)0x0) {
            p_Var10 = (_Hash_node_base *)0x0;
            if (((ulong)*(uint *)&_Var8._M_nxt[1]._M_nxt % uVar6 != uVar11) ||
               (p_Var10 = _Var14._M_nxt, _Var14._M_nxt = _Var8._M_nxt,
               uVar2 == *(uint *)&_Var8._M_nxt[1]._M_nxt)) goto LAB_0017de1b;
          }
          p_Var10 = (_Hash_node_base *)0x0;
        }
LAB_0017de1b:
        if ((p_Var10 == (_Hash_node_base *)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0)) {
          puVar1 = (ulong *)(col3.super_Row_access_option._0_8_ + (ulong)(uVar2 >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
        }
        ppEVar12 = ppEVar12 + 1;
      } while (ppEVar12 != ppEVar4);
    }
  }
  __last1_02.super__Bit_iterator_base._M_p._4_4_ = col3._20_4_;
  __last1_02.super__Bit_iterator_base._M_p._0_4_ = col3.super_Column_dimension_option.dim_;
  __last1_02.super__Bit_iterator_base._M_offset =
       col3.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  if (((ulong)col3.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start & 0xffffffff) +
      (CONCAT44(col3._20_4_,col3.super_Column_dimension_option.dim_) -
      col3.super_Row_access_option._0_8_) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first1_02.super__Bit_iterator_base._8_8_ = 0;
    __first1_02.super__Bit_iterator_base._M_p = (_Bit_type *)col3.super_Row_access_option._0_8_;
    __last1_02.super__Bit_iterator_base._12_4_ = 0;
    __first2_02.super__Bit_iterator_base._8_8_ = 0;
    __first2_02.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    bVar9 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_02,__last1_02,__first2_02);
  }
  else {
    bVar9 = false;
  }
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT71(container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,bVar9);
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._12_4_ = 0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_4f0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x1f2a05;
  pcStack_4e8 = "";
  col4.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col4.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022f388;
  col4._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1c0 = "";
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_4f0;
  boost::test_tools::tt_detail::report_assertion(&container_5,&col4,&local_1c8,0x3d8,1,0,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish);
  if (col3.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col3.super_Row_access_option._0_8_,
                    (long)col3.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    col3.super_Row_access_option._0_8_);
    col3.super_Row_access_option.columnIndex_ = 0;
    col3.super_Row_access_option._4_4_ = 0;
    col3.super_Row_access_option.rows_ =
         (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffff00000000);
    col3.super_Column_dimension_option.dim_ = 0;
    col3._20_4_ = 0;
    col3.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)col3.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    col3.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x3da);
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._8_8_ & 0xffffffffffffff00;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_0022f440;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = &boost::unit_test::lazy_ostream::inst;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0x1ec196;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._12_4_ = 0;
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_4f8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )(((long)*(pointer *)
                         ((long)&pVVar3[5].column_.
                                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                                 ._M_impl + 8) -
                  *(long *)&pVVar3[5].column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data >> 3) -
                pVVar3[5].erasedValues_._M_h._M_element_count);
  local_4c8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )&local_4d0;
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022f400;
  col3.super_Column_dimension_option.dim_ = 0x237120;
  col3._20_4_ = 0;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_440;
  local_4f0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)CONCAT71(local_4f0._1_7_,
                          local_4f8 ==
                          (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                           )0x5);
  local_4d0 = (undefined4 *)CONCAT44(local_4d0._4_4_,5);
  pcStack_4e8 = (char *)0x0;
  sStack_4e0.pi_ = (sp_counted_base *)0x0;
  col4.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col4.super_Row_access_option.rows_ & 0xffffffffffffff00);
  local_428 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x1ecc81;
  local_420 = "";
  local_440 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )&local_4f8;
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022f6c0;
  col4._16_8_ = &boost::unit_test::lazy_ostream::inst;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_4c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_4f0,&container_5,&local_428,0x3da,1,2,2,"matrix[5].size()",&col3,"5",&col4);
  boost::detail::shared_count::~shared_count(&sStack_4e0);
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x300000002;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 6;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&container_5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,__l_01,
             (allocator_type *)&local_4f0);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::Vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)&col3,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,&settings);
  if (col4.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col4.super_Row_access_option._0_8_,
                    col4._16_8_ - col4.super_Row_access_option._0_8_);
  }
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  _add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 5),&col3);
  col4.super_Row_access_option._0_7_ = 0x10001000101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,&col4);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x3e0);
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
           (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
           veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar13 < 0) {
    ppEVar12 = *(pointer *)
                ((long)&pVVar3[5].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar12 !=
        pVVar3[5].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = ppEVar12[-1]->rowIndex_ + 1;
      goto LAB_0017e22a;
    }
    col4.super_Column_dimension_option.dim_ = 0;
    col4._20_4_ = 0;
    col4.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    col4.super_Row_access_option.columnIndex_ = 0;
    col4.super_Row_access_option._4_4_ = 0;
    col4.super_Row_access_option.rows_ = (Row_container *)0x0;
    col4.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
LAB_0017e22a:
    container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
    .super__Bit_iterator_base._M_p =
         (_Bit_type *)
         ((ulong)container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
         0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col4,(long)(int)uVar13,(bool *)&container_5,
               (allocator_type *)&local_428);
    ppEVar12 = pVVar3[5].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppEVar4 = *(pointer *)
               ((long)&pVVar3[5].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar12 != ppEVar4) {
      pp_Var5 = pVVar3[5].erasedValues_._M_h._M_buckets;
      do {
        uVar2 = (*ppEVar12)->rowIndex_;
        if (uVar13 <= uVar2) break;
        uVar6 = pVVar3[5].erasedValues_._M_h._M_bucket_count;
        uVar11 = (ulong)uVar2 % uVar6;
        p_Var7 = pp_Var5[uVar11];
        p_Var10 = (_Hash_node_base *)0x0;
        if ((p_Var7 != (__node_base_ptr)0x0) &&
           (p_Var10 = p_Var7, _Var14._M_nxt = p_Var7->_M_nxt,
           uVar2 != *(uint *)&p_Var7->_M_nxt[1]._M_nxt)) {
          while (_Var8._M_nxt = (_Var14._M_nxt)->_M_nxt, _Var8._M_nxt != (_Hash_node_base *)0x0) {
            p_Var10 = (_Hash_node_base *)0x0;
            if (((ulong)*(uint *)&_Var8._M_nxt[1]._M_nxt % uVar6 != uVar11) ||
               (p_Var10 = _Var14._M_nxt, _Var14._M_nxt = _Var8._M_nxt,
               uVar2 == *(uint *)&_Var8._M_nxt[1]._M_nxt)) goto LAB_0017e2db;
          }
          p_Var10 = (_Hash_node_base *)0x0;
        }
LAB_0017e2db:
        if ((p_Var10 == (_Hash_node_base *)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0)) {
          puVar1 = (ulong *)(col4.super_Row_access_option._0_8_ + (ulong)(uVar2 >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
        }
        ppEVar12 = ppEVar12 + 1;
      } while (ppEVar12 != ppEVar4);
    }
  }
  __last1_03.super__Bit_iterator_base._M_offset =
       col4.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  __last1_03.super__Bit_iterator_base._M_p = (_Bit_type *)col4._16_8_;
  if (((ulong)col4.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start & 0xffffffff) +
      (col4._16_8_ - col4.super_Row_access_option._0_8_) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first1_03.super__Bit_iterator_base._8_8_ = 0;
    __first1_03.super__Bit_iterator_base._M_p = (_Bit_type *)col4.super_Row_access_option._0_8_;
    __last1_03.super__Bit_iterator_base._12_4_ = 0;
    __first2_03.super__Bit_iterator_base._8_8_ = 0;
    __first2_03.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    bVar9 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_03,__last1_03,__first2_03);
  }
  else {
    bVar9 = false;
  }
  local_4f0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)CONCAT71(local_4f0._1_7_,bVar9);
  pcStack_4e8 = (char *)0x0;
  sStack_4e0.pi_ = (sp_counted_base *)0x0;
  local_428 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x1f2a05;
  local_420 = "";
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._8_8_ & 0xffffffffffffff00;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_0022f388;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = &boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_210 = "";
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_428;
  boost::test_tools::tt_detail::report_assertion(&local_4f0,&container_5,&local_218,0x3e0,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_4e0);
  if (col4.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col4.super_Row_access_option._0_8_,
                    (long)col4.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    col4.super_Row_access_option._0_8_);
    col4.super_Row_access_option.columnIndex_ = 0;
    col4.super_Row_access_option._4_4_ = 0;
    col4.super_Row_access_option.rows_ =
         (Row_container *)((ulong)col4.super_Row_access_option.rows_ & 0xffffffff00000000);
    col4.super_Column_dimension_option.dim_ = 0;
    col4._20_4_ = 0;
    col4.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)col4.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    col4.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_228,0x3e2);
  pcStack_4e8 = (char *)((ulong)pcStack_4e8 & 0xffffffffffffff00);
  local_4f0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)&PTR__lazy_ostream_0022f440;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x1ec196;
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_4d0 = (undefined4 *)
              (((long)*(pointer *)
                       ((long)&pVVar3[5].column_.
                               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                               ._M_impl + 8) -
                *(long *)&pVVar3[5].column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data >> 3) -
              pVVar3[5].erasedValues_._M_h._M_element_count);
  local_4f8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )&local_310;
  col4.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col4.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022f400;
  col4._16_8_ = &boost::unit_test::lazy_ostream::inst;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_4c8;
  local_428 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)CONCAT71(local_428._1_7_,local_4d0 == (undefined4 *)0x4);
  local_310 = CONCAT44(local_310._4_4_,4);
  local_420 = (char *)0x0;
  sStack_418.pi_ = (sp_counted_base *)0x0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._8_8_ & 0xffffffffffffff00;
  local_440 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )0x1ecc81;
  local_438 = "";
  local_4c8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )&local_4d0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_0022f6c0;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = &boost::unit_test::lazy_ostream::inst;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_4f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_428,&local_4f0,&local_440,0x3e2,1,2,2,"matrix[5].size()",&col4,"4",&container_5)
  ;
  boost::detail::shared_count::~shared_count(&sStack_418);
  local_4f0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x100000000;
  pcStack_4e8 = (char *)0x500000003;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_4f0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&container_5,__l_02,
             (allocator_type *)&local_428);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::Vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)&col4,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&container_5,&settings)
  ;
  if (container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    (long)container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT71(container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,1);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  multiply_target_and_add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 3),(Field_element *)&container_5,&col4
            );
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT17(container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._7_1_,0x10001000101)
  ;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,&container_5);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_248,1000);
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_finish.super__Bit_iterator_base._M_p -
           (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
           veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar13 < 0) {
    ppEVar12 = *(pointer *)
                ((long)&pVVar3[3].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar12 ==
        pVVar3[3].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ = 0;
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._12_4_ = 0;
      container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      goto LAB_0017e7bf;
    }
    uVar13 = ppEVar12[-1]->rowIndex_ + 1;
  }
  local_4f0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)((ulong)local_4f0 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&container_5,(long)(int)uVar13,(bool *)&local_4f0,(allocator_type *)&local_440);
  ppEVar12 = pVVar3[3].column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppEVar4 = *(pointer *)
             ((long)&pVVar3[3].column_.
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                     ._M_impl + 8);
  if (ppEVar12 != ppEVar4) {
    pp_Var5 = pVVar3[3].erasedValues_._M_h._M_buckets;
    do {
      uVar2 = (*ppEVar12)->rowIndex_;
      if (uVar13 <= uVar2) break;
      uVar6 = pVVar3[3].erasedValues_._M_h._M_bucket_count;
      uVar11 = (ulong)uVar2 % uVar6;
      p_Var7 = pp_Var5[uVar11];
      p_Var10 = (_Hash_node_base *)0x0;
      if ((p_Var7 != (__node_base_ptr)0x0) &&
         (p_Var10 = p_Var7, _Var14._M_nxt = p_Var7->_M_nxt,
         uVar2 != *(uint *)&p_Var7->_M_nxt[1]._M_nxt)) {
        while (_Var8._M_nxt = (_Var14._M_nxt)->_M_nxt, _Var8._M_nxt != (_Hash_node_base *)0x0) {
          p_Var10 = (_Hash_node_base *)0x0;
          if (((ulong)*(uint *)&_Var8._M_nxt[1]._M_nxt % uVar6 != uVar11) ||
             (p_Var10 = _Var14._M_nxt, _Var14._M_nxt = _Var8._M_nxt,
             uVar2 == *(uint *)&_Var8._M_nxt[1]._M_nxt)) goto LAB_0017e77e;
        }
        p_Var10 = (_Hash_node_base *)0x0;
      }
LAB_0017e77e:
      if ((p_Var10 == (_Hash_node_base *)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0)) {
        container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] =
             container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f);
      }
      ppEVar12 = ppEVar12 + 1;
    } while (ppEVar12 != ppEVar4);
  }
LAB_0017e7bf:
  __last1_04.super__Bit_iterator_base._M_offset =
       container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  __last1_04.super__Bit_iterator_base._M_p =
       container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  if ((container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff) +
      ((long)container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
             ._M_finish.super__Bit_iterator_base._M_p -
      (long)container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first1_04.super__Bit_iterator_base._8_8_ = 0;
    __first1_04.super__Bit_iterator_base._M_p =
         container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __last1_04.super__Bit_iterator_base._12_4_ = 0;
    __first2_04.super__Bit_iterator_base._8_8_ = 0;
    __first2_04.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    bVar9 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_04,__last1_04,__first2_04);
  }
  else {
    bVar9 = false;
  }
  local_428 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)CONCAT71(local_428._1_7_,bVar9);
  local_420 = (char *)0x0;
  sStack_418.pi_ = (sp_counted_base *)0x0;
  local_440 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )0x1f2a4b;
  local_438 = "";
  pcStack_4e8 = (char *)((ulong)pcStack_4e8 & 0xffffffffffffff00);
  local_4f0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)&PTR__lazy_ostream_0022f388;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_260 = "";
  local_4d8 = &local_440;
  boost::test_tools::tt_detail::report_assertion(&local_428,&local_4f0,&local_268,1000,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_418);
  if (container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
    .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
    .super__Bit_iterator_base._8_8_ =
         container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._8_8_ =
         container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_278,0x3ea);
  local_420 = (char *)((ulong)local_420 & 0xffffffffffffff00);
  local_428 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)&PTR__lazy_ostream_0022f440;
  sStack_418.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_410 = "";
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_310 = ((long)*(pointer *)
                      ((long)&pVVar3[3].column_.
                              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                              ._M_impl + 8) -
               *(long *)&pVVar3[3].column_.
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data >> 3) -
              pVVar3[3].erasedValues_._M_h._M_element_count;
  local_4d0 = &local_28c;
  local_440.super_Entry_column_index_option.columnIndex_._0_1_ = local_310 == 4;
  local_28c = 4;
  local_438 = (char *)0x0;
  sStack_430.pi_ = (sp_counted_base *)0x0;
  local_4c8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )0x1ecc81;
  local_4c0 = "";
  local_4f8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )&local_310;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._8_8_ & 0xffffffffffffff00;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_0022f400;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = &boost::unit_test::lazy_ostream::inst;
  container_5.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_4f8;
  pcStack_4e8 = (char *)((ulong)pcStack_4e8 & 0xffffffffffffff00);
  local_4f0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)&PTR__lazy_ostream_0022f6c0;
  sStack_4e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4d8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)&local_4d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_430);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::~Vector_column(&col4);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::~Vector_column(&col3);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::~Vector_column(&col2);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::~Vector_column(&col1);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::~Vector_column(&col0);
  if (veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void column_test_boundary_z2_operators(std::vector<Column>& matrix) {
  using cont = std::vector<unsigned int>;

  std::vector<bool> veccont;
  typename Column::Column_settings settings;

  const Column col0(cont{0, 1, 2, 5, 6}, &settings);
  matrix[0] += col0;

  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 3);
  }

  const Column col1(cont{0, 1, 2, 5, 6}, &settings);
  matrix[1] += col1;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(3, col1);
  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 3);
  }
  // this = this + column * v
  const Column col2(cont{}, &settings);
  matrix[5].multiply_source_and_add(col2, 3);
  veccont = {1, 1, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  }
  // this = this + column * v
  const Column col3(cont{2, 3, 6}, &settings);
  matrix[5].multiply_source_and_add(col3, 3);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 4);
  }
  // this = v * this + column
  const Column col4(cont{0, 1, 3, 5}, &settings);
  matrix[3].multiply_target_and_add(4, col4);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 4);
  }
}